

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  bool bVar1;
  uint uVar2;
  reference ppIVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar4;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  IReporter **curr_rep;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  String *in_stack_fffffffffffffef0;
  String *in_stack_fffffffffffffef8;
  String *in_stack_ffffffffffffff00;
  bool local_d9;
  String *in_stack_ffffffffffffff30;
  String *in_stack_ffffffffffffff38;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_c0;
  long local_b8;
  String local_98 [3];
  String local_50;
  byte local_21;
  ResultBuilder *local_8;
  
  local_8 = this;
  if (((this->super_AssertData).m_at & is_throws) == 0) {
    if ((((this->super_AssertData).m_at & is_throws_as) == 0) ||
       (((this->super_AssertData).m_at & is_throws_with) == 0)) {
      if (((this->super_AssertData).m_at & is_throws_as) == 0) {
        if (((this->super_AssertData).m_at & is_throws_with) == 0) {
          if (((this->super_AssertData).m_at & is_nothrow) != 0) {
            (this->super_AssertData).m_failed = (bool)((this->super_AssertData).m_threw & 1);
          }
        }
        else {
          in_stack_fffffffffffffef8 = &(this->super_AssertData).m_exception;
          in_stack_ffffffffffffff00 = &local_50;
          String::String(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
          bVar1 = operator!=(in_stack_fffffffffffffef0,
                             (String *)
                             CONCAT17(in_stack_fffffffffffffeef,
                                      CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))
                            );
          (this->super_AssertData).m_failed = bVar1;
          String::~String(in_stack_ffffffffffffff00);
        }
      }
      else {
        (this->super_AssertData).m_failed =
             (bool)(((this->super_AssertData).m_threw_as ^ 0xffU) & 1);
      }
    }
    else {
      local_21 = 0;
      local_d9 = true;
      if (((this->super_AssertData).m_threw_as & 1U) != 0) {
        String::String(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        local_21 = 1;
        local_d9 = operator!=(in_stack_fffffffffffffef0,
                              (String *)
                              CONCAT17(in_stack_fffffffffffffeef,
                                       CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)
                                      ));
      }
      (this->super_AssertData).m_failed = local_d9;
      if ((local_21 & 1) != 0) {
        String::~String(in_stack_ffffffffffffff00);
      }
    }
  }
  else {
    (this->super_AssertData).m_failed = (bool)(((this->super_AssertData).m_threw ^ 0xffU) & 1);
  }
  uVar2 = String::size((String *)
                       CONCAT17(in_stack_fffffffffffffeef,
                                CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  dVar4 = extraout_XMM0_Qa;
  if (uVar2 != 0) {
    in_stack_fffffffffffffef0 = local_98;
    String::String(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    String::String(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    String::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    String::~String(in_stack_ffffffffffffff00);
    String::~String(in_stack_ffffffffffffff00);
    String::~String(in_stack_ffffffffffffff00);
    String::~String(in_stack_ffffffffffffff00);
    dVar4 = extraout_XMM0_Qa_00;
  }
  if ((is_running_in_test & 1) == 0) {
    if (((this->super_AssertData).m_failed & 1U) != 0) {
      failed_out_of_a_testing_context((AssertData *)0x10a701);
      dVar4 = extraout_XMM0_Qa_03;
    }
  }
  else {
    anon_unknown_14::addAssert(0);
    local_b8 = g_cs + 0x10d0;
    local_c0._M_current =
         (IReporter **)
         std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                   ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
                    CONCAT17(in_stack_fffffffffffffeef,
                             CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
    std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
              ((vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)
               CONCAT17(in_stack_fffffffffffffeef,
                        CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                               *)in_stack_fffffffffffffef0,
                              (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffffeef,
                                          CONCAT16(in_stack_fffffffffffffeee,
                                                   in_stack_fffffffffffffee8))), bVar1) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator*(&local_c0);
      (*(*ppIVar3)->_vptr_IReporter[9])(*ppIVar3,this);
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&local_c0);
    }
    dVar4 = extraout_XMM0_Qa_01;
    if (((this->super_AssertData).m_failed & 1U) != 0) {
      anon_unknown_14::addFailedAssert(0);
      dVar4 = extraout_XMM0_Qa_02;
    }
  }
  if ((((this->super_AssertData).m_failed & 1U) != 0) &&
     (bVar1 = isDebuggerActive(), dVar4 = extraout_XMM0_Qa_04, bVar1)) {
    getContextOptions();
    dVar4 = extraout_XMM0_Qa_05;
  }
  return dVar4;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }